

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-syscalls.c
# Opt level: O0

int uv__epoll_wait(int epfd,uv__epoll_event *events,int nevents,int timeout)

{
  long lVar1;
  int result;
  int timeout_local;
  int nevents_local;
  uv__epoll_event *events_local;
  int epfd_local;
  
  lVar1 = syscall(0xe8,(ulong)(uint)epfd,events,(ulong)(uint)nevents,(ulong)(uint)timeout);
  return (int)lVar1;
}

Assistant:

int uv__epoll_wait(int epfd,
                   struct uv__epoll_event* events,
                   int nevents,
                   int timeout) {
#if defined(__NR_epoll_wait)
  int result;
  result = syscall(__NR_epoll_wait, epfd, events, nevents, timeout);
#if MSAN_ACTIVE
  if (result > 0)
    __msan_unpoison(events, sizeof(events[0]) * result);
#endif
  return result;
#else
  return errno = ENOSYS, -1;
#endif
}